

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

void start_pass_fdctmgr(j_compress_ptr cinfo)

{
  double dVar1;
  uint uVar2;
  J_DCT_METHOD JVar3;
  jpeg_forward_dct *pjVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  jpeg_component_info *pjVar7;
  _func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
  *p_Var8;
  long lVar9;
  JQUANT_TBL *pJVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (0 < cinfo->num_components) {
    pjVar7 = cinfo->comp_info;
    pjVar4 = cinfo->fdct;
    iVar14 = 0;
    do {
      uVar2 = pjVar7->quant_tbl_no;
      uVar15 = (ulong)uVar2;
      if ((3 < uVar15) || (pJVar10 = cinfo->quant_tbl_ptrs[uVar15], pJVar10 == (JQUANT_TBL *)0x0)) {
        uVar15 = (ulong)(int)uVar2;
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x34;
        (pjVar5->msg_parm).i[0] = uVar2;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        pJVar10 = cinfo->quant_tbl_ptrs[uVar15];
      }
      JVar3 = cinfo->dct_method;
      if (JVar3 == JDCT_FLOAT) {
        p_Var8 = (&pjVar4[6].forward_DCT)[uVar15];
        if (p_Var8 == (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                       *)0x0) {
          p_Var8 = (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                    *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          (&pjVar4[6].forward_DCT)[uVar15] = p_Var8;
        }
        lVar9 = 0;
        lVar16 = 0;
        do {
          lVar11 = (long)(int)lVar16;
          lVar16 = lVar11 + 8;
          dVar1 = start_pass_fdctmgr::aanscalefactor[lVar9];
          pdVar12 = start_pass_fdctmgr::aanscalefactor;
          lVar13 = 0;
          do {
            auVar18._0_8_ =
                 (double)(*(uint *)(pJVar10->quantval + lVar11 + lVar13) & 0xffff) * dVar1 *
                 *pdVar12 * 8.0;
            auVar18._8_8_ =
                 (double)(*(uint *)(pJVar10->quantval + lVar11 + lVar13) >> 0x10) * dVar1 *
                 pdVar12[1] * 8.0;
            auVar17._8_8_ = 0x3ff0000000000000;
            auVar17._0_8_ = 0x3ff0000000000000;
            auVar18 = divpd(auVar17,auVar18);
            *(ulong *)(p_Var8 + lVar13 * 4 + lVar11 * 4) =
                 CONCAT44((float)auVar18._8_8_,(float)auVar18._0_8_);
            lVar13 = lVar13 + 2;
            pdVar12 = pdVar12 + 2;
          } while (lVar13 != 8);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
      }
      else if (JVar3 == JDCT_IFAST) {
        p_Var8 = (&pjVar4[2].forward_DCT)[uVar15];
        if (p_Var8 == (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                       *)0x0) {
          p_Var8 = (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                    *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x200);
          (&pjVar4[2].forward_DCT)[uVar15] = p_Var8;
        }
        lVar16 = 0;
        do {
          iVar6 = compute_reciprocal((UINT16)((int)*(short *)((long)start_pass_fdctmgr::aanscales +
                                                             lVar16) *
                                              (uint)*(ushort *)((long)pJVar10->quantval + lVar16) +
                                              0x400 >> 0xb),(DCTELEM *)(p_Var8 + lVar16));
          if ((iVar6 == 0) && (pjVar4[2].start_pass == jsimd_quantize)) {
            pjVar4[2].start_pass = quantize;
          }
          lVar16 = lVar16 + 2;
        } while (lVar16 != 0x80);
      }
      else if (JVar3 == JDCT_ISLOW) {
        p_Var8 = (&pjVar4[2].forward_DCT)[uVar15];
        if (p_Var8 == (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                       *)0x0) {
          p_Var8 = (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
                    *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x200);
          (&pjVar4[2].forward_DCT)[uVar15] = p_Var8;
        }
        lVar16 = 0;
        do {
          iVar6 = compute_reciprocal(*(short *)((long)pJVar10->quantval + lVar16) << 3,
                                     (DCTELEM *)(p_Var8 + lVar16));
          if ((iVar6 == 0) && (pjVar4[2].start_pass == jsimd_quantize)) {
            pjVar4[2].start_pass = quantize;
          }
          lVar16 = lVar16 + 2;
        } while (lVar16 != 0x80);
      }
      else {
        pjVar5 = cinfo->err;
        pjVar5->msg_code = 0x30;
        (*pjVar5->error_exit)((j_common_ptr)cinfo);
      }
      iVar14 = iVar14 + 1;
      pjVar7 = pjVar7 + 1;
    } while (iVar14 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_fdctmgr(j_compress_ptr cinfo)
{
  my_fdct_ptr fdct = (my_fdct_ptr)cinfo->fdct;
  int ci, qtblno, i;
  jpeg_component_info *compptr;
  JQUANT_TBL *qtbl;
  DCTELEM *dtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    qtblno = compptr->quant_tbl_no;
    /* Make sure specified quantization table is present */
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
        cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    qtbl = cinfo->quant_tbl_ptrs[qtblno];
    /* Compute divisors for this quant table */
    /* We may do this more than once for same table, but it's not a big deal */
    switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
    case JDCT_ISLOW:
      /* For LL&M IDCT method, divisors are equal to raw quantization
       * coefficients multiplied by 8 (to counteract scaling).
       */
      if (fdct->divisors[qtblno] == NULL) {
        fdct->divisors[qtblno] = (DCTELEM *)
          (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                      (DCTSIZE2 * 4) * sizeof(DCTELEM));
      }
      dtbl = fdct->divisors[qtblno];
      for (i = 0; i < DCTSIZE2; i++) {
#if BITS_IN_JSAMPLE == 8
        if (!compute_reciprocal(qtbl->quantval[i] << 3, &dtbl[i]) &&
            fdct->quantize == jsimd_quantize)
          fdct->quantize = quantize;
#else
        dtbl[i] = ((DCTELEM)qtbl->quantval[i]) << 3;
#endif
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
        /* For AA&N IDCT method, divisors are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * We apply a further scale factor of 8.
         */
#define CONST_BITS  14
        static const INT16 aanscales[DCTSIZE2] = {
          /* precomputed values scaled up by 14 bits */
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
          21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
          19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
          16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
          12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
           8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
           4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
        };
        SHIFT_TEMPS

        if (fdct->divisors[qtblno] == NULL) {
          fdct->divisors[qtblno] = (DCTELEM *)
            (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                        (DCTSIZE2 * 4) * sizeof(DCTELEM));
        }
        dtbl = fdct->divisors[qtblno];
        for (i = 0; i < DCTSIZE2; i++) {
#if BITS_IN_JSAMPLE == 8
          if (!compute_reciprocal(
                DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                      (JLONG)aanscales[i]),
                        CONST_BITS - 3), &dtbl[i]) &&
              fdct->quantize == jsimd_quantize)
            fdct->quantize = quantize;
#else
          dtbl[i] = (DCTELEM)
            DESCALE(MULTIPLY16V16((JLONG)qtbl->quantval[i],
                                  (JLONG)aanscales[i]),
                    CONST_BITS - 3);
#endif
        }
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
        /* For float AA&N IDCT method, divisors are equal to quantization
         * coefficients scaled by scalefactor[row]*scalefactor[col], where
         *   scalefactor[0] = 1
         *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
         * We apply a further scale factor of 8.
         * What's actually stored is 1/divisor so that the inner loop can
         * use a multiplication rather than a division.
         */
        FAST_FLOAT *fdtbl;
        int row, col;
        static const double aanscalefactor[DCTSIZE] = {
          1.0, 1.387039845, 1.306562965, 1.175875602,
          1.0, 0.785694958, 0.541196100, 0.275899379
        };

        if (fdct->float_divisors[qtblno] == NULL) {
          fdct->float_divisors[qtblno] = (FAST_FLOAT *)
            (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                        DCTSIZE2 * sizeof(FAST_FLOAT));
        }
        fdtbl = fdct->float_divisors[qtblno];
        i = 0;
        for (row = 0; row < DCTSIZE; row++) {
          for (col = 0; col < DCTSIZE; col++) {
            fdtbl[i] = (FAST_FLOAT)
              (1.0 / (((double)qtbl->quantval[i] *
                       aanscalefactor[row] * aanscalefactor[col] * 8.0)));
            i++;
          }
        }
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}